

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O2

Inst * __thiscall mir::inst::LoadInst::deep_copy(LoadInst *this)

{
  LoadInst *this_00;
  VarId local_40;
  Value local_30;
  
  this_00 = (LoadInst *)operator_new(0x38);
  Value::Value(&local_30,&this->src);
  local_40.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  local_40.id = (this->super_Inst).dest.id;
  LoadInst(this_00,&local_30,&local_40);
  return &this_00->super_Inst;
}

Assistant:

Inst* deep_copy() { return new LoadInst(src, dest); }